

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O3

xmlNodePtr xmlDocSetRootElement(xmlDocPtr doc,xmlNodePtr root)

{
  bool bVar1;
  int iVar2;
  xmlNodePtr old;
  bool bVar3;
  
  if ((root != (xmlNodePtr)0x0 && doc != (xmlDocPtr)0x0) && (root->type != XML_NAMESPACE_DECL)) {
    old = doc->children;
    if (old == (xmlNodePtr)0x0) {
      bVar1 = true;
    }
    else {
      do {
        bVar3 = old->type == XML_ELEMENT_NODE;
        bVar1 = !bVar3;
        if (bVar3) goto LAB_0014ff74;
        old = old->next;
      } while (old != (_xmlNode *)0x0);
    }
    old = (xmlNodePtr)0x0;
LAB_0014ff74:
    if (old == root) {
      return old;
    }
    xmlUnlinkNodeInternal(root);
    iVar2 = xmlSetTreeDoc(root,doc);
    if (-1 < iVar2) {
      root->parent = (_xmlNode *)doc;
      if (!bVar1) {
        xmlReplaceNode(old,root);
        return old;
      }
      if (doc->children == (xmlNodePtr)0x0) {
        doc->children = root;
        doc->last = root;
      }
      else {
        xmlAddSibling(doc->children,root);
      }
    }
  }
  return (xmlNodePtr)0x0;
}

Assistant:

xmlNodePtr
xmlDocSetRootElement(xmlDocPtr doc, xmlNodePtr root) {
    xmlNodePtr old = NULL;

    if (doc == NULL) return(NULL);
    if ((root == NULL) || (root->type == XML_NAMESPACE_DECL))
	return(NULL);
    old = doc->children;
    while (old != NULL) {
	if (old->type == XML_ELEMENT_NODE)
	    break;
        old = old->next;
    }
    if (old == root)
        return(old);
    xmlUnlinkNodeInternal(root);
    if (xmlSetTreeDoc(root, doc) < 0)
        return(NULL);
    root->parent = (xmlNodePtr) doc;
    if (old == NULL) {
	if (doc->children == NULL) {
	    doc->children = root;
	    doc->last = root;
	} else {
	    xmlAddSibling(doc->children, root);
	}
    } else {
	xmlReplaceNode(old, root);
    }
    return(old);
}